

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_func_vararg(jit_State *J)

{
  uint uVar1;
  GCproto *pGVar2;
  uint uVar3;
  uint local_28;
  BCReg vframe;
  BCReg fixargs;
  BCReg s;
  GCproto *pt;
  jit_State *J_local;
  
  pGVar2 = J->pt;
  uVar1 = J->maxslot;
  uVar3 = uVar1 + 2;
  if (0xf9 < J->baseslot + uVar3 + (uint)pGVar2->framesize) {
    lj_trace_err(J,LJ_TRERR_STACKOV);
  }
  J->base[uVar1] = J->base[-2];
  J->base[uVar1 + 1] = 0x10000;
  if ((uint)pGVar2->numparams < J->maxslot) {
    local_28 = (uint)pGVar2->numparams;
  }
  else {
    local_28 = J->maxslot;
  }
  for (vframe = 0; vframe < local_28; vframe = vframe + 1) {
    J->base[uVar3 + vframe] = J->base[vframe];
    J->base[vframe] = 0x7fff;
  }
  J->maxslot = local_28;
  J->framedepth = J->framedepth + 1;
  J->base = J->base + uVar3;
  J->baseslot = uVar3 + J->baseslot;
  return;
}

Assistant:

static void rec_func_vararg(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, fixargs, vframe = J->maxslot+1+LJ_FR2;
  lj_assertJ((pt->flags & PROTO_VARARG), "FUNCV in non-vararg function");
  if (J->baseslot + vframe + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  J->base[vframe-1-LJ_FR2] = J->base[-1-LJ_FR2];  /* Copy function up. */
#if LJ_FR2
  J->base[vframe-1] = TREF_FRAME;
#endif
  /* Copy fixarg slots up and set their original slots to nil. */
  fixargs = pt->numparams < J->maxslot ? pt->numparams : J->maxslot;
  for (s = 0; s < fixargs; s++) {
    J->base[vframe+s] = J->base[s];
    J->base[s] = TREF_NIL;
  }
  J->maxslot = fixargs;
  J->framedepth++;
  J->base += vframe;
  J->baseslot += vframe;
}